

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O2

void anon_unknown.dwarf_b46359::MakeTreeRelative(aiNode *start,aiMatrix4x4 *combined)

{
  aiMatrix4x4 *m;
  bool bVar1;
  aiMatrix4x4t<float> *paVar2;
  uint i;
  ulong uVar3;
  aiMatrix4x4 old;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4 local_d8;
  aiMatrix4x4t<float> local_98;
  aiMatrix4x4t<float> local_58;
  
  local_d8.a1 = (start->mTransformation).a1;
  local_d8.a2 = (start->mTransformation).a2;
  local_d8.a3 = (start->mTransformation).a3;
  local_d8.a4 = (start->mTransformation).a4;
  local_d8.b1 = (start->mTransformation).b1;
  local_d8.b2 = (start->mTransformation).b2;
  local_d8.b3 = (start->mTransformation).b3;
  local_d8.b4 = (start->mTransformation).b4;
  local_d8.c1 = (start->mTransformation).c1;
  local_d8.c2 = (start->mTransformation).c2;
  local_d8.c3 = (start->mTransformation).c3;
  local_d8.c4 = (start->mTransformation).c4;
  local_d8.d1 = (start->mTransformation).d1;
  local_d8.d2 = (start->mTransformation).d2;
  local_d8.d3 = (start->mTransformation).d3;
  local_d8.d4 = (start->mTransformation).d4;
  bVar1 = aiMatrix4x4t<float>::IsIdentity(combined);
  if (!bVar1) {
    m = &start->mTransformation;
    local_98.a1 = combined->a1;
    local_98.a2 = combined->a2;
    local_98.a3 = combined->a3;
    local_98.a4 = combined->a4;
    local_98.b1 = combined->b1;
    local_98.b2 = combined->b2;
    local_98.b3 = combined->b3;
    local_98.b4 = combined->b4;
    local_98.c1 = combined->c1;
    local_98.c2 = combined->c2;
    local_98.c3 = combined->c3;
    local_98.c4 = combined->c4;
    local_98.d1 = combined->d1;
    local_98.d2 = combined->d2;
    local_98.d3 = combined->d3;
    local_98.d4 = combined->d4;
    paVar2 = aiMatrix4x4t<float>::Inverse(&local_98);
    local_58.a1 = paVar2->a1;
    local_58.a2 = paVar2->a2;
    local_58.a3 = paVar2->a3;
    local_58.a4 = paVar2->a4;
    local_58.b1 = paVar2->b1;
    local_58.b2 = paVar2->b2;
    local_58.b3 = paVar2->b3;
    local_58.b4 = paVar2->b4;
    local_58.c1 = paVar2->c1;
    local_58.c2 = paVar2->c2;
    local_58.c3 = paVar2->c3;
    local_58.c4 = paVar2->c4;
    local_58.d1 = paVar2->d1;
    local_58.d2 = paVar2->d2;
    local_58.d3 = paVar2->d3;
    local_58.d4 = paVar2->d4;
    aiMatrix4x4t<float>::operator*=(&local_58,m);
    m->a1 = local_58.a1;
    m->a2 = local_58.a2;
    (start->mTransformation).a3 = local_58.a3;
    (start->mTransformation).a4 = local_58.a4;
    (start->mTransformation).b1 = local_58.b1;
    (start->mTransformation).b2 = local_58.b2;
    (start->mTransformation).b3 = local_58.b3;
    (start->mTransformation).b4 = local_58.b4;
    (start->mTransformation).c1 = local_58.c1;
    (start->mTransformation).c2 = local_58.c2;
    (start->mTransformation).c3 = local_58.c3;
    (start->mTransformation).c4 = local_58.c4;
    (start->mTransformation).d1 = local_58.d1;
    (start->mTransformation).d2 = local_58.d2;
    (start->mTransformation).d3 = local_58.d3;
    (start->mTransformation).d4 = local_58.d4;
  }
  for (uVar3 = 0; uVar3 < start->mNumChildren; uVar3 = uVar3 + 1) {
    MakeTreeRelative(start->mChildren[uVar3],&local_d8);
  }
  return;
}

Assistant:

void MakeTreeRelative(aiNode* start, const aiMatrix4x4& combined)
{
    // combined is the parent's absolute transformation matrix
    const aiMatrix4x4 old = start->mTransformation;

    if (!combined.IsIdentity()) {
        start->mTransformation = aiMatrix4x4(combined).Inverse() * start->mTransformation;
    }

    // All nodes store absolute transformations right now, so we need to make them relative
    for (unsigned int i = 0; i < start->mNumChildren; ++i) {
        MakeTreeRelative(start->mChildren[i],old);
    }
}